

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1-client.c
# Opt level: O1

void ssh1_queue_succfail_handler
               (ssh1_connection_state *s,sf_handler_fn_t handler,void *ctx,_Bool trivial)

{
  outstanding_succfail *poVar1;
  outstanding_succfail **ppoVar2;
  
  poVar1 = (outstanding_succfail *)safemalloc(1,0x20,0);
  poVar1->handler = handler;
  poVar1->ctx = ctx;
  poVar1->trivial = trivial;
  poVar1->next = (outstanding_succfail *)0x0;
  ppoVar2 = &s->succfail_tail->next;
  if (s->succfail_tail == (outstanding_succfail *)0x0) {
    ppoVar2 = &s->succfail_head;
  }
  *ppoVar2 = poVar1;
  s->succfail_tail = poVar1;
  queue_toplevel_callback(ssh1_connection_process_trivial_succfails,s);
  return;
}

Assistant:

static void ssh1_queue_succfail_handler(
    struct ssh1_connection_state *s, sf_handler_fn_t handler, void *ctx,
    bool trivial)
{
    struct outstanding_succfail *osf = snew(struct outstanding_succfail);
    osf->handler = handler;
    osf->ctx = ctx;
    osf->trivial = trivial;
    osf->next = NULL;
    if (s->succfail_tail)
        s->succfail_tail->next = osf;
    else
        s->succfail_head = osf;
    s->succfail_tail = osf;

    /* In case this one was trivial and the queue was already empty,
     * we should make sure we run the handler promptly, and the
     * easiest way is to queue it anyway and then run a trivials pass
     * by callback. */
    queue_toplevel_callback(ssh1_connection_process_trivial_succfails, s);
}